

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_first_step1.cpp
# Opt level: O1

bool __thiscall
ruckig::PositionFirstOrderStep1::get_profile
          (PositionFirstOrderStep1 *this,Profile *input,Block *block)

{
  double vUp;
  bool bVar1;
  long lVar2;
  BrakeProfile *pBVar3;
  BrakeProfile *pBVar4;
  
  (block->p_min).a._M_elems[0] = (input->a)._M_elems[0];
  (block->p_min).v._M_elems[0] = (input->v)._M_elems[0];
  (block->p_min).p._M_elems[0] = (input->p)._M_elems[0];
  (block->p_min).af = input->af;
  (block->p_min).vf = input->vf;
  (block->p_min).pf = input->pf;
  pBVar3 = &input->brake;
  pBVar4 = &(block->p_min).brake;
  for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
    pBVar4->duration = pBVar3->duration;
    pBVar3 = (BrakeProfile *)&pBVar3->t;
    pBVar4 = (BrakeProfile *)&pBVar4->t;
  }
  pBVar3 = &input->accel;
  pBVar4 = &(block->p_min).accel;
  for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
    pBVar4->duration = pBVar3->duration;
    pBVar3 = (BrakeProfile *)&pBVar3->t;
    pBVar4 = (BrakeProfile *)&pBVar4->t;
  }
  vUp = (&this->_vMax)[this->pd <= 0.0];
  (block->p_min).t._M_elems[2] = 0.0;
  (block->p_min).t._M_elems[0] = 0.0;
  (block->p_min).t._M_elems[1] = 0.0;
  (block->p_min).t._M_elems[3] = this->pd / vUp;
  (block->p_min).t._M_elems[4] = 0.0;
  (block->p_min).t._M_elems[5] = 0.0;
  (block->p_min).t._M_elems[6] = 0.0;
  bVar1 = Profile::
          check_for_first_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)1>
                    (&block->p_min,vUp);
  if (bVar1) {
    block->t_min = (block->p_min).t_sum._M_elems[6] + (block->p_min).brake.duration +
                   (block->p_min).accel.duration;
  }
  return bVar1;
}

Assistant:

bool PositionFirstOrderStep1::get_profile(const Profile& input, Block& block) {
    auto& p = block.p_min;
    p.set_boundary(input);

    const double vf = (pd > 0) ? _vMax : _vMin;
    p.t[0] = 0;
    p.t[1] = 0;
    p.t[2] = 0;
    p.t[3] = pd / vf;
    p.t[4] = 0;
    p.t[5] = 0;
    p.t[6] = 0;

    if (p.check_for_first_order<Profile::ControlSigns::UDDU, Profile::ReachedLimits::VEL>(vf)) {
        block.t_min = p.t_sum.back() + p.brake.duration + p.accel.duration;
        return true;
    }
    return false;
}